

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::loop(EventLoop *this)

{
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  byte bVar2;
  int v;
  LogStream *pLVar3;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined1 local_1010 [8];
  shared_ptr<Channel> channel;
  
  if (this->looping_ != true) {
    assertInLoopThread(this);
    this->looping_ = true;
    Logger::Logger((Logger *)local_1010,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                   ,0x32);
    pLVar3 = LogStream::operator<<((LogStream *)local_1010,"Thread ");
    pLVar3 = LogStream::operator<<(pLVar3,this->threadId_);
    LogStream::operator<<(pLVar3," start looping");
    Logger::~Logger((Logger *)local_1010);
    this->quit_ = false;
    bVar2 = 0;
    while ((bVar2 & 1) == 0) {
      std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::clear
                (&this->activeChannels_);
      ((this->timer_).super___shared_ptr<TimerHeap,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->timeFlag_ =
           true;
      EPoller::epoll((this->poller_).super___shared_ptr<EPoller,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     -1,&this->activeChannels_);
      p_Var1 = &((this->activeChannels_).
                 super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>;
      for (p_Var4 = &((this->activeChannels_).
                      super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>; p_Var4 != p_Var1;
          p_Var4 = p_Var4 + 1) {
        std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)local_1010,p_Var4);
        if (*(EventLoop **)((long)local_1010 + 0x10) == this) {
          Channel::handleEvent((Channel *)local_1010);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&channel);
      }
      doPendingFuntors(this);
      bVar2 = this->quit_;
    }
    Logger::Logger((Logger *)local_1010,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                   ,0x3f);
    pLVar3 = LogStream::operator<<((LogStream *)local_1010,"EventLoop in thread ");
    v = CurrentThread::tid();
    pLVar3 = LogStream::operator<<(pLVar3,v);
    LogStream::operator<<(pLVar3," stop looping");
    Logger::~Logger((Logger *)local_1010);
    this->looping_ = false;
    return;
  }
  __assert_fail("!looping_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                ,0x2f,"void EventLoop::loop()");
}

Assistant:

void EventLoop::loop() {
    assert(!looping_);
    assertInLoopThread();
    looping_ = true;
    LOG <<"Thread " << threadId_ << " start looping";
    quit_ = false;
    while (!quit_) {
        activeChannels_.clear();
        timer_->setTimeFlag();
        poller_->epoll(-1, &activeChannels_);
        for (auto channel: activeChannels_) {
            if (channel->ownerLoop() == this)
                channel->handleEvent();
        }
        doPendingFuntors();
    }

    LOG << "EventLoop in thread " << CurrentThread::tid() << " stop looping";
    looping_ = false;
}